

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onExitIfStatementAstNode
          (CompilerAstWalker *this,IfStatementAstNode *node)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  size_t index;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  value_type local_50;
  size_t jumpIndex;
  size_t ifEvalIndex;
  string local_38;
  IfStatementAstNode *local_18;
  IfStatementAstNode *node_local;
  CompilerAstWalker *this_local;
  
  local_18 = node;
  node_local = (IfStatementAstNode *)this;
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (&peVar2->ifConditionEvalJumpIndices);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "onExitIfStatementAstNode encountered if exit statement but ifConditionEvalJumpIndices is empty"
             ,(allocator<char> *)((long)&ifEvalIndex + 7));
  Error::assertWithPanic(!bVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ifEvalIndex + 7));
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (&peVar3->ifConditionEvalJumpIndices);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar2->ifConditionEvalJumpIndices,sVar4 - 1);
  jumpIndex = *pvVar5;
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            (&peVar2->ifConditionEvalJumpIndices);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_18->elseStatement);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (&peVar2->elseStatementStartIndex);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "onExitIfStatementAstNode encountered if exit statement with valid ekse but elseStatementStartIndex is empty"
               ,&local_71);
    Error::assertWithPanic(!bVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    peVar3 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&peVar3->elseStatementStartIndex);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&peVar2->elseStatementStartIndex,sVar4 - 1);
    local_50 = *pvVar5;
    bVar1 = local_50 != 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               "onExitIfStatementAstNode encountered jumpIndex == 0 for after if statement -> jump past else"
               ,&local_99);
    Error::assertWithPanic(bVar1,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    index = local_50 - 1;
    peVar3 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    sVar4 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                      (&peVar3->byteCode);
    EmissionContext::UpdateParameterAtIndex(peVar2,index,sVar4);
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              (&peVar2->elseStatementStartIndex);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    local_50 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                         (&peVar2->byteCode);
  }
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  EmissionContext::UpdateParameterAtIndex(peVar2,jumpIndex,local_50);
  return;
}

Assistant:

void onExitIfStatementAstNode(IfStatementAstNode* node) noexcept override {
    Error::assertWithPanic(!this->ec->ifConditionEvalJumpIndices.empty(),
      "onExitIfStatementAstNode encountered if exit statement but ifConditionEvalJumpIndices is empty");

    std::size_t ifEvalIndex = this->ec->ifConditionEvalJumpIndices.at(this->ec->ifConditionEvalJumpIndices.size() - 1);
    this->ec->ifConditionEvalJumpIndices.pop_back();

    std::size_t jumpIndex;

    if (node->elseStatement) {
      Error::assertWithPanic(!this->ec->elseStatementStartIndex.empty(),
        "onExitIfStatementAstNode encountered if exit statement with valid ekse but elseStatementStartIndex is empty");

      jumpIndex = this->ec->elseStatementStartIndex.at(this->ec->elseStatementStartIndex.size() - 1);

      Error::assertWithPanic(jumpIndex > 0,
        "onExitIfStatementAstNode encountered jumpIndex == 0 for after if statement -> jump past else");

      this->ec->UpdateParameterAtIndex(jumpIndex - 1, this->ec->byteCode.size());

      this->ec->elseStatementStartIndex.pop_back();

    } else {
      jumpIndex = this->ec->byteCode.size();
    }

    this->ec->UpdateParameterAtIndex(ifEvalIndex, jumpIndex);
  }